

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

array<unsigned_char,_4UL> string2byte<4u>(string *s,int base,char sep)

{
  array<unsigned_char,_4UL> aVar1;
  array<unsigned_char,_4UL> result;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  splitted;
  _Type local_98;
  int local_94;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  local_90;
  
  local_94 = base;
  split<4u>((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
             *)local_90._M_elems,s,sep);
  std::
  transform<std::__cxx11::string_const*,unsigned_char*,string2byte<4u>(std::__cxx11::string_const&,int,char)::_lambda(std::__cxx11::string_const&)_1_>
            (local_90._M_elems,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff0,local_98,(anon_class_8_1_8989b3cf)&local_94);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
  ~array(&local_90);
  aVar1._M_elems[0] = local_98[0];
  aVar1._M_elems[1] = local_98[1];
  aVar1._M_elems[2] = local_98[2];
  aVar1._M_elems[3] = local_98[3];
  return (array<unsigned_char,_4UL>)aVar1._M_elems;
}

Assistant:

std::array<uint8_t, n> string2byte(const std::string& s,
                                   const int base,
                                   const char sep)
{
  const auto splitted = split<n>(s, sep);

  std::array<uint8_t, n> result;

  std::transform(std::begin(splitted),
                 std::end(splitted),
                 std::begin(result),
                 [&base](const std::string& s) -> std::uint8_t
  {
    const auto v = std::stoul(s, nullptr, base);
    if (v > 255)
    {
      throw std::out_of_range("number is larger than 255");
    }
    return static_cast<std::uint8_t>(v);
  });

  return result;
}